

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall mjs::object::fixup(object *this)

{
  if ((this->class_).pos_ != 0) {
    gc_heap::register_fixup(this->heap_,&(this->class_).pos_);
  }
  if ((this->prototype_).pos_ != 0) {
    gc_heap::register_fixup(this->heap_,&(this->prototype_).pos_);
  }
  if ((this->properties_).pos_ != 0) {
    gc_heap::register_fixup(this->heap_,&(this->properties_).pos_);
    return;
  }
  return;
}

Assistant:

void object::fixup() {
    class_.fixup(heap_);
    prototype_.fixup(heap_);
    properties_.fixup(heap_);
}